

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

void __thiscall
cmsys::CommandLineArguments::PopulateVariable
          (CommandLineArguments *this,vector<double,_std::allocator<double>_> *variable,
          string *value)

{
  char *__nptr;
  double local_30;
  char *local_28;
  char *res;
  string *value_local;
  vector<double,_std::allocator<double>_> *variable_local;
  CommandLineArguments *this_local;
  
  local_28 = (char *)0x0;
  res = (char *)value;
  value_local = (string *)variable;
  variable_local = (vector<double,_std::allocator<double>_> *)this;
  __nptr = (char *)std::__cxx11::string::c_str();
  local_30 = strtod(__nptr,&local_28);
  std::vector<double,_std::allocator<double>_>::push_back(variable,&local_30);
  return;
}

Assistant:

void CommandLineArguments::PopulateVariable(
  std::vector<double>* variable, const std::string& value)
{
  char* res = 0;
  variable->push_back(strtod(value.c_str(), &res));
  //if ( res && *res )
  //  {
  //  Can handle non-int
  //  }
}